

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamTaperedTimoshenko.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementBeamTaperedTimoshenko::ComputeInternalForces
          (ChElementBeamTaperedTimoshenko *this,ChVectorDynamic<> *Fi)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  pointer psVar8;
  element_type *peVar9;
  element_type *peVar10;
  element_type *peVar11;
  ChVectorDynamic<> *pCVar12;
  Index size;
  long lVar13;
  DstEvaluatorType dstEvaluator;
  char *pcVar14;
  Index index;
  ulong uVar15;
  ulong uVar16;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var17;
  double *pdVar18;
  double dVar19;
  double dVar20;
  ulong uVar21;
  long lVar22;
  long lVar23;
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  vector<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_> R;
  ChVectorDynamic<> Fi_local;
  ChMatrixDynamic<> FiR_local;
  ChVectorDynamic<> displ_dt;
  ChVectorDynamic<> displ;
  ChVector<double> mFcent_i;
  ChVector<double> mTgyro_i;
  ChMatrix33<double> Atoabs;
  ChMatrix33<double> AtolocwelB;
  ChMatrix33<double> AtolocwelA;
  vector<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_> local_238;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_218;
  DenseStorage<double,__1,__1,__1,_1> local_208;
  ChVectorDynamic<> *local_1f0;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_1e8;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_1d8;
  Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_> local_1c8;
  double local_180 [7];
  double local_148;
  ChElementBeamTaperedTimoshenko *local_140;
  ChMatrixRef local_138;
  ChMatrix33<double> local_110;
  ChMatrix33<double> local_c8;
  ChMatrix33<double> local_78;
  
  if ((Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows != 0xc)
  {
    __assert_fail("Fi.size() == 12",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/fea/ChElementBeamTaperedTimoshenko.cpp"
                  ,0x401,
                  "virtual void chrono::fea::ChElementBeamTaperedTimoshenko::ComputeInternalForces(ChVectorDynamic<> &)"
                 );
  }
  if ((this->tapered_section).
      super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr == (element_type *)0x0) {
    __assert_fail("tapered_section",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/fea/ChElementBeamTaperedTimoshenko.cpp"
                  ,0x402,
                  "virtual void chrono::fea::ChElementBeamTaperedTimoshenko::ComputeInternalForces(ChVectorDynamic<> &)"
                 );
  }
  local_1d8.m_storage.m_data = (double *)0x0;
  local_1d8.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_1d8,0xc);
  (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase._vptr_ChElementBase[6])
            (this,&local_1d8);
  if ((this->Km).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols
      != local_1d8.m_storage.m_rows) {
LAB_00685fdd:
    __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                  ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,
                  "Eigen::Product<Eigen::Matrix<double, -1, -1, 1>, Eigen::Matrix<double, -1, 1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Matrix<double, -1, -1, 1>, Rhs = Eigen::Matrix<double, -1, 1>, Option = 0]"
                 );
  }
  local_218.m_storage.m_data = (double *)0x0;
  local_218.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&local_218,
             (this->Km).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
             m_rows,1);
  dVar20 = (double)(this->Km).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                   m_storage.m_rows;
  if ((double)local_218.m_storage.m_rows != dVar20) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              (&local_218,(Index)dVar20,1);
  }
  if (-1 < local_218.m_storage.m_rows) {
    if ((double)local_218.m_storage.m_rows != 0.0) {
      memset(local_218.m_storage.m_data,0,local_218.m_storage.m_rows << 3);
    }
    local_110.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] = 1.0;
    Eigen::internal::
    generic_product_impl<Eigen::Matrix<double,-1,-1,1,-1,-1>,Eigen::Matrix<double,-1,1,0,-1,1>,Eigen::DenseShape,Eigen::DenseShape,7>
    ::scaleAndAddTo<Eigen::Matrix<double,_1,1,0,_1,1>>
              ((Matrix<double,__1,_1,_0,__1,_1> *)&local_218,&this->Km,
               (Matrix<double,__1,_1,_0,__1,_1> *)&local_1d8,(Scalar *)&local_110);
    local_1e8.m_storage.m_data = (double *)0x0;
    local_1e8.m_storage.m_rows = 0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_1e8,0xc);
    GetField_dt(this,(ChVectorDynamic<> *)&local_1e8);
    if ((this->Rm).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols
        != local_1e8.m_storage.m_rows) goto LAB_00685fdd;
    local_208.m_data = (double *)0x0;
    local_208.m_rows = 0;
    local_208.m_cols = 0;
    lVar22 = (this->Rm).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
             m_rows;
    if (lVar22 < 0) {
LAB_00686013:
      __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                    ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,
                    "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, -1, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, -1, 1>]"
                   );
    }
    Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize(&local_208,lVar22,lVar22,1);
    dVar20 = (double)(this->Rm).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                     m_storage.m_rows;
    if (((double)local_208.m_rows != dVar20) || ((double)local_208.m_cols != 4.94065645841247e-324))
    {
      if ((long)dVar20 < 0) goto LAB_00686013;
      Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize(&local_208,(Index)dVar20,(Index)dVar20,1);
    }
    local_110.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
         (double)local_208.m_rows;
    local_110.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
         (double)local_208.m_cols;
    local_110.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] = 0.0;
    if ((local_208.m_cols | local_208.m_rows) < 0) {
      pcVar14 = 
      "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, -1, 1>]"
      ;
      goto LAB_00686085;
    }
    Eigen::internal::call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,1,_1,_1>>
              ((Matrix<double,__1,__1,_1,__1,__1> *)&local_208,
               (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                *)&local_110,(assign_op<double,_double> *)&local_78);
    local_110.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] = 1.0;
    Eigen::internal::
    generic_product_impl<Eigen::Matrix<double,-1,-1,1,-1,-1>,Eigen::Matrix<double,-1,1,0,-1,1>,Eigen::DenseShape,Eigen::DenseShape,7>
    ::scaleAndAddTo<Eigen::Matrix<double,_1,_1,1,_1,_1>>
              ((Matrix<double,__1,__1,_1,__1,__1> *)&local_208,&this->Rm,
               (Matrix<double,__1,_1,_0,__1,_1> *)&local_1e8,(Scalar *)&local_110);
    if ((local_218.m_storage.m_rows != local_208.m_rows) ||
       ((double)local_208.m_cols != 4.94065645841247e-324)) {
      __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                    "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2f2,
                    "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::Matrix<double, -1, -1, 1>, Functor = Eigen::internal::add_assign_op<double, double>]"
                   );
    }
    if (0 < local_218.m_storage.m_rows) {
      dVar20 = 0.0;
      pdVar18 = local_208.m_data;
      do {
        local_218.m_storage.m_data[(long)dVar20] =
             *pdVar18 + local_218.m_storage.m_data[(long)dVar20];
        dVar20 = (double)((long)dVar20 + 1);
        pdVar18 = pdVar18 + 1;
      } while ((double)local_218.m_storage.m_rows != dVar20);
    }
    if (-1 < local_218.m_storage.m_rows) {
      dVar20 = (double)(local_218.m_storage.m_rows & 0x7ffffffffffffff8);
      if (7 < local_218.m_storage.m_rows) {
        dVar19 = 0.0;
        auVar24 = vbroadcastsd_avx512f(ZEXT816(0x8000000000000000));
        do {
          auVar25 = vxorpd_avx512dq(auVar24,*(undefined1 (*) [64])
                                             (local_218.m_storage.m_data + (long)dVar19));
          *(undefined1 (*) [64])(local_218.m_storage.m_data + (long)dVar19) = auVar25;
          dVar19 = (double)((long)dVar19 + 8);
        } while ((ulong)dVar19 < (ulong)dVar20);
      }
      if ((long)dVar20 < local_218.m_storage.m_rows) {
        do {
          auVar29._0_8_ = -local_218.m_storage.m_data[(long)dVar20];
          auVar29._8_8_ = 0x8000000000000000;
          dVar19 = (double)vmovlpd_avx(auVar29);
          local_218.m_storage.m_data[(long)dVar20] = dVar19;
          dVar20 = (double)((long)dVar20 + 1);
        } while ((double)local_218.m_storage.m_rows != dVar20);
      }
      ChMatrix33<double>::ChMatrix33(&local_110,&this->q_element_abs_rot);
      psVar8 = (this->nodes).
               super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      peVar9 = (psVar8->super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
               )._M_ptr;
      p_Var17 = (psVar8->
                super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount._M_pi;
      if (p_Var17 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var17->_M_use_count = p_Var17->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var17->_M_use_count = p_Var17->_M_use_count + 1;
        }
      }
      auVar26._8_8_ = 0;
      auVar26._0_8_ = *(ulong *)&peVar9->field_0x38;
      dVar20 = *(double *)&peVar9->field_0x40;
      auVar30._8_8_ = 0;
      auVar30._0_8_ = dVar20;
      auVar33._8_8_ = 0;
      auVar33._0_8_ = *(double *)&peVar9->field_0x48;
      auVar36._8_8_ = 0;
      auVar36._0_8_ = *(double *)&peVar9->field_0x50;
      dVar19 = (this->q_element_abs_rot).m_data[0];
      auVar41._8_8_ = 0;
      auVar41._0_8_ = dVar19;
      dVar1 = (this->q_element_abs_rot).m_data[1];
      auVar44._8_8_ = 0;
      auVar44._0_8_ = dVar1;
      auVar46._8_8_ = 0;
      auVar46._0_8_ = dVar20 * dVar1;
      auVar29 = vfmadd231sd_fma(auVar46,auVar26,auVar41);
      auVar48._8_8_ = 0;
      auVar48._0_8_ = (this->q_element_abs_rot).m_data[2];
      auVar29 = vfmadd231sd_fma(auVar29,auVar33,auVar48);
      auVar50._8_8_ = 0;
      auVar50._0_8_ = (this->q_element_abs_rot).m_data[3];
      auVar29 = vfmadd231sd_fma(auVar29,auVar36,auVar50);
      auVar52._8_8_ = 0;
      auVar52._0_8_ = dVar19 * dVar20;
      auVar41 = vfmsub231sd_fma(auVar52,auVar26,auVar44);
      auVar41 = vfmadd231sd_fma(auVar41,auVar36,auVar48);
      auVar46 = vfnmadd231sd_fma(auVar41,auVar33,auVar50);
      auVar54._8_8_ = 0;
      auVar54._0_8_ = dVar19 * *(double *)&peVar9->field_0x48;
      auVar41 = vfmsub231sd_fma(auVar54,auVar26,auVar48);
      auVar41 = vfnmadd231sd_fma(auVar41,auVar36,auVar44);
      auVar41 = vfmadd231sd_fma(auVar41,auVar30,auVar50);
      auVar37._8_8_ = 0;
      auVar37._0_8_ = dVar19 * *(double *)&peVar9->field_0x50;
      auVar26 = vfmsub231sd_fma(auVar37,auVar26,auVar50);
      auVar26 = vfmadd231sd_fma(auVar26,auVar33,auVar44);
      auVar26 = vfnmadd231sd_fma(auVar26,auVar30,auVar48);
      local_c8.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
           auVar29._0_8_;
      local_c8.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
           auVar46._0_8_;
      local_c8.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
           auVar41._0_8_;
      local_c8.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
           auVar26._0_8_;
      ChMatrix33<double>::ChMatrix33(&local_78,(ChQuaternion<double> *)&local_c8);
      local_1f0 = Fi;
      if (p_Var17 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var17);
      }
      psVar8 = (this->nodes).
               super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      peVar9 = psVar8[1].
               super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      p_Var17 = psVar8[1].
                super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
      if (p_Var17 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var17->_M_use_count = p_Var17->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var17->_M_use_count = p_Var17->_M_use_count + 1;
        }
      }
      auVar27._8_8_ = 0;
      auVar27._0_8_ = *(ulong *)&peVar9->field_0x38;
      dVar20 = *(double *)&peVar9->field_0x40;
      auVar31._8_8_ = 0;
      auVar31._0_8_ = dVar20;
      auVar34._8_8_ = 0;
      auVar34._0_8_ = *(double *)&peVar9->field_0x48;
      auVar38._8_8_ = 0;
      auVar38._0_8_ = *(double *)&peVar9->field_0x50;
      dVar19 = (this->q_element_abs_rot).m_data[0];
      auVar42._8_8_ = 0;
      auVar42._0_8_ = dVar19;
      dVar1 = (this->q_element_abs_rot).m_data[1];
      auVar45._8_8_ = 0;
      auVar45._0_8_ = dVar1;
      auVar47._8_8_ = 0;
      auVar47._0_8_ = dVar20 * dVar1;
      auVar29 = vfmadd231sd_fma(auVar47,auVar27,auVar42);
      auVar49._8_8_ = 0;
      auVar49._0_8_ = (this->q_element_abs_rot).m_data[2];
      auVar29 = vfmadd231sd_fma(auVar29,auVar34,auVar49);
      auVar51._8_8_ = 0;
      auVar51._0_8_ = (this->q_element_abs_rot).m_data[3];
      auVar29 = vfmadd231sd_fma(auVar29,auVar38,auVar51);
      auVar53._8_8_ = 0;
      auVar53._0_8_ = dVar19 * dVar20;
      auVar41 = vfmsub231sd_fma(auVar53,auVar27,auVar45);
      auVar41 = vfmadd231sd_fma(auVar41,auVar38,auVar49);
      auVar46 = vfnmadd231sd_fma(auVar41,auVar34,auVar51);
      auVar55._8_8_ = 0;
      auVar55._0_8_ = dVar19 * *(double *)&peVar9->field_0x48;
      auVar41 = vfmsub231sd_fma(auVar55,auVar27,auVar49);
      auVar41 = vfnmadd231sd_fma(auVar41,auVar38,auVar45);
      auVar41 = vfmadd231sd_fma(auVar41,auVar31,auVar51);
      auVar39._8_8_ = 0;
      auVar39._0_8_ = dVar19 * *(double *)&peVar9->field_0x50;
      auVar26 = vfmsub231sd_fma(auVar39,auVar27,auVar51);
      auVar26 = vfmadd231sd_fma(auVar26,auVar34,auVar45);
      auVar26 = vfnmadd231sd_fma(auVar26,auVar31,auVar49);
      local_1c8.
      super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      .
      super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
      .m_data = auVar29._0_8_;
      local_1c8.
      super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      .
      super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
      .m_rows.m_value = auVar46._0_8_;
      local_1c8.
      super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      .
      super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
      .m_cols.m_value = auVar41._0_8_;
      local_1c8.
      super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      .m_stride.m_outer.m_value = auVar26._0_8_;
      ChMatrix33<double>::ChMatrix33(&local_c8,(ChQuaternion<double> *)&local_1c8);
      if (p_Var17 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var17);
      }
      local_238.
      super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_238.
      super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = (ChMatrix33<double> **)0x0;
      local_238.
      super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (ChMatrix33<double> **)0x0;
      local_1c8.
      super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      .
      super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
      .m_data = (PointerType)&local_110;
      std::vector<chrono::ChMatrix33<double>*,std::allocator<chrono::ChMatrix33<double>*>>::
      _M_realloc_insert<chrono::ChMatrix33<double>*>
                ((vector<chrono::ChMatrix33<double>*,std::allocator<chrono::ChMatrix33<double>*>> *)
                 &local_238,(iterator)0x0,(ChMatrix33<double> **)&local_1c8);
      pCVar12 = local_1f0;
      if (local_238.
          super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          local_238.
          super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        local_1c8.
        super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
        .
        super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
        .m_data = (PointerType)&local_78;
        std::vector<chrono::ChMatrix33<double>*,std::allocator<chrono::ChMatrix33<double>*>>::
        _M_realloc_insert<chrono::ChMatrix33<double>*>
                  ((vector<chrono::ChMatrix33<double>*,std::allocator<chrono::ChMatrix33<double>*>>
                    *)&local_238,
                   (iterator)
                   local_238.
                   super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish,(ChMatrix33<double> **)&local_1c8);
      }
      else {
        *local_238.
         super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
         ._M_impl.super__Vector_impl_data._M_finish = &local_78;
        local_238.
        super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_238.
             super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1;
      }
      if (local_238.
          super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          local_238.
          super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        local_1c8.
        super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
        .
        super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
        .m_data = (PointerType)&local_110;
        std::vector<chrono::ChMatrix33<double>*,std::allocator<chrono::ChMatrix33<double>*>>::
        _M_realloc_insert<chrono::ChMatrix33<double>*>
                  ((vector<chrono::ChMatrix33<double>*,std::allocator<chrono::ChMatrix33<double>*>>
                    *)&local_238,
                   (iterator)
                   local_238.
                   super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish,(ChMatrix33<double> **)&local_1c8);
      }
      else {
        *local_238.
         super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
         ._M_impl.super__Vector_impl_data._M_finish = &local_110;
        local_238.
        super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_238.
             super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1;
      }
      if (local_238.
          super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          local_238.
          super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        local_1c8.
        super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
        .
        super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
        .m_data = (PointerType)&local_c8;
        std::vector<chrono::ChMatrix33<double>*,std::allocator<chrono::ChMatrix33<double>*>>::
        _M_realloc_insert<chrono::ChMatrix33<double>*>
                  ((vector<chrono::ChMatrix33<double>*,std::allocator<chrono::ChMatrix33<double>*>>
                    *)&local_238,
                   (iterator)
                   local_238.
                   super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish,(ChMatrix33<double> **)&local_1c8);
      }
      else {
        *local_238.
         super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
         ._M_impl.super__Vector_impl_data._M_finish = &local_c8;
        local_238.
        super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_238.
             super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1;
      }
      local_1c8.
      super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      .m_stride.m_outer.m_value = 0;
      local_1c8.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
      m_data = (double *)0x0;
      local_1c8.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
      m_rows = 0;
      local_1c8.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
      m_cols = 0;
      local_1c8.
      super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      .
      super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
      .m_data = local_218.m_storage.m_data;
      local_1c8.
      super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      .
      super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
      .m_rows.m_value = local_218.m_storage.m_rows;
      local_1c8.
      super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      .
      super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
      .m_cols.m_value = 1;
      if (local_218.m_storage.m_rows < 0 && local_218.m_storage.m_data != (double *)0x0) {
        pcVar14 = 
        "Eigen::MapBase<Eigen::Ref<const Eigen::Matrix<double, -1, -1, 1>>>::MapBase(PointerType, Index, Index) [Derived = Eigen::Ref<const Eigen::Matrix<double, -1, -1, 1>>, Level = 0]"
        ;
      }
      else {
        local_1c8.
        super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
        .m_stride.m_outer.m_value = 1;
        local_138.
        super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
        .m_stride.m_outer.m_value = 0;
        local_138.
        super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
        .
        super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
        .
        super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
        .m_data = (pCVar12->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                  m_storage.m_data;
        local_138.
        super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
        .
        super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
        .
        super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
        .m_rows.m_value =
             (pCVar12->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_rows;
        local_138.
        super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
        .
        super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
        .
        super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
        .m_cols.m_value = 1;
        if (-1 < local_138.
                 super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                 .
                 super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                 .
                 super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                 .m_rows.m_value ||
            local_138.
            super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
            .
            super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
            .
            super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
            .m_data == (double *)0x0) {
          local_138.
          super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
          .m_stride.m_outer.m_value = 1;
          ChMatrixCorotation::ComputeCK(&local_1c8,&local_238,4,&local_138);
          if (local_1c8.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_data != (double *)0x0) {
            free((void *)local_1c8.m_object.
                         super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
                         m_data[-1]);
          }
          local_1c8.
          super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
          .
          super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
          .m_cols.m_value = 0;
          local_1c8.
          super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
          .
          super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
          .m_data = (PointerType)0x0;
          local_1c8.
          super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
          .
          super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
          .m_rows.m_value = 0;
          local_180[5] = 0.0;
          local_180[3] = 0.0;
          local_180[4] = 0.0;
          if ((this->nodes).
              super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              (this->nodes).
              super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            local_148 = (this->super_ChElementBeam).length * 0.5;
            lVar22 = 0x18;
            lVar23 = 0;
            uVar16 = 0;
            local_140 = this;
            do {
              peVar10 = (local_140->tapered_section).
                        super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr;
              if (uVar16 == 0) {
                peVar11 = (peVar10->sectionA).
                          super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr;
                p_Var17 = (peVar10->sectionA).
                          super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi;
                if (p_Var17 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    p_Var17->_M_use_count = p_Var17->_M_use_count + 1;
                    UNLOCK();
                  }
                  else {
                    p_Var17->_M_use_count = p_Var17->_M_use_count + 1;
                  }
                }
                ChFrameMoving<double>::GetWvel_loc
                          ((ChFrameMoving<double> *)
                           &(((((local_140->nodes).
                                super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->
                              super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                              )._M_ptr)->super_ChNodeFEAbase).field_0x18);
                (**(code **)(*(long *)&(peVar11->super_ChBeamSectionRayleighAdvancedGeneric).
                                       super_ChBeamSectionEulerAdvancedGeneric.
                                       super_ChBeamSectionEuler + 0x80))
                          (peVar11,&local_1c8,local_180 + 3,local_180);
              }
              else {
                peVar11 = (peVar10->sectionB).
                          super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr;
                p_Var17 = (peVar10->sectionB).
                          super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi;
                if (p_Var17 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    p_Var17->_M_use_count = p_Var17->_M_use_count + 1;
                    UNLOCK();
                  }
                  else {
                    p_Var17->_M_use_count = p_Var17->_M_use_count + 1;
                  }
                }
                ChFrameMoving<double>::GetWvel_loc
                          ((ChFrameMoving<double> *)
                           &(((local_140->nodes).
                              super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar16].
                              super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->super_ChNodeFEAbase).field_0x18);
                (**(code **)(*(long *)&(peVar11->super_ChBeamSectionRayleighAdvancedGeneric).
                                       super_ChBeamSectionEulerAdvancedGeneric.
                                       super_ChBeamSectionEuler + 0x80))
                          (peVar11,&local_1c8,local_180 + 3,local_180);
              }
              if (p_Var17 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var17);
              }
              peVar9 = (local_140->nodes).
                       super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar16].
                       super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr;
              auVar28._8_8_ = 0;
              auVar28._0_8_ =
                   local_1c8.
                   super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                   .
                   super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                   .m_data;
              auVar2._8_8_ = 0;
              auVar2._0_8_ = *(ulong *)&peVar9->field_0x58;
              auVar35._8_8_ = 0;
              auVar35._0_8_ =
                   (double)local_1c8.
                           super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                           .
                           super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                           .m_rows.m_value * *(double *)&peVar9->field_0x60;
              auVar29 = vfmadd231sd_fma(auVar35,auVar28,auVar2);
              auVar40._8_8_ = 0;
              auVar40._0_8_ =
                   local_1c8.
                   super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                   .
                   super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                   .m_cols.m_value;
              auVar3._8_8_ = 0;
              auVar3._0_8_ = *(ulong *)&peVar9->field_0x68;
              auVar29 = vfmadd231sd_fma(auVar29,auVar40,auVar3);
              auVar4._8_8_ = 0;
              auVar4._0_8_ = *(ulong *)&peVar9->field_0x70;
              auVar43._8_8_ = 0;
              auVar43._0_8_ =
                   (double)local_1c8.
                           super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                           .
                           super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                           .m_rows.m_value * *(double *)&peVar9->field_0x78;
              auVar41 = vfmadd231sd_fma(auVar43,auVar28,auVar4);
              auVar5._8_8_ = 0;
              auVar5._0_8_ = *(ulong *)&peVar9->field_0x80;
              auVar41 = vfmadd231sd_fma(auVar41,auVar40,auVar5);
              auVar6._8_8_ = 0;
              auVar6._0_8_ = *(ulong *)&peVar9->field_0x88;
              auVar32._8_8_ = 0;
              auVar32._0_8_ =
                   (double)local_1c8.
                           super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                           .
                           super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                           .m_rows.m_value * *(double *)&peVar9->field_0x90;
              auVar26 = vfmadd231sd_fma(auVar32,auVar28,auVar6);
              auVar7._8_8_ = 0;
              auVar7._0_8_ = *(ulong *)&peVar9->field_0x98;
              auVar26 = vfmadd231sd_fma(auVar26,auVar40,auVar7);
              local_180[0] = auVar29._0_8_;
              local_180[1] = (double)auVar41._0_8_;
              local_180[2] = (double)auVar26._0_8_;
              if ((local_1f0->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                  m_storage.m_rows + -3 < (long)(uVar16 * 6)) {
LAB_00685fbe:
                __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                              ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                              "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                             );
              }
              pdVar18 = (local_1f0->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                        m_storage.m_data;
              uVar15 = 3;
              if ((((ulong)(pdVar18 + uVar16 * 6) & 7) == 0) &&
                 (uVar15 = (ulong)(-((uint)((ulong)(pdVar18 + uVar16 * 6) >> 3) & 0x1fffffff) & 7),
                 2 < uVar15)) {
                uVar15 = 3;
              }
              if (uVar15 != 0) {
                uVar21 = 0;
                do {
                  *(double *)((long)pdVar18 + uVar21 * 8 + lVar23) =
                       *(double *)((long)pdVar18 + uVar21 * 8 + lVar23) -
                       local_148 * local_180[uVar21];
                  uVar21 = uVar21 + 1;
                } while (uVar15 != uVar21);
              }
              if (uVar15 < 3) {
                do {
                  *(double *)((long)pdVar18 + uVar15 * 8 + lVar23) =
                       *(double *)((long)pdVar18 + uVar15 * 8 + lVar23) -
                       local_148 * local_180[uVar15];
                  uVar15 = uVar15 + 1;
                } while (uVar15 != 3);
              }
              if ((local_1f0->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                  m_storage.m_rows + -3 < (long)(uVar16 * 6 + 3)) goto LAB_00685fbe;
              pdVar18 = (local_1f0->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                        m_storage.m_data;
              uVar15 = 3;
              if ((((ulong)(pdVar18 + uVar16 * 6 + 3) & 7) == 0) &&
                 (uVar15 = (ulong)(-((uint)((ulong)(pdVar18 + uVar16 * 6 + 3) >> 3) & 0x1fffffff) &
                                  7), 2 < uVar15)) {
                uVar15 = 3;
              }
              if (uVar15 != 0) {
                uVar21 = 0;
                do {
                  *(double *)((long)pdVar18 + uVar21 * 8 + lVar22) =
                       *(double *)((long)pdVar18 + uVar21 * 8 + lVar22) -
                       local_148 * local_180[uVar21 + 3];
                  uVar21 = uVar21 + 1;
                } while (uVar15 != uVar21);
              }
              if (uVar15 < 3) {
                lVar13 = uVar15 + 3;
                do {
                  *(double *)((long)pdVar18 + lVar13 * 8 + lVar23) =
                       *(double *)((long)pdVar18 + lVar13 * 8 + lVar23) -
                       local_148 * local_180[lVar13];
                  lVar13 = lVar13 + 1;
                } while (lVar13 != 6);
              }
              uVar16 = uVar16 + 1;
              lVar23 = lVar23 + 0x30;
              lVar22 = lVar22 + 0x30;
            } while (uVar16 < (ulong)((long)(local_140->nodes).
                                            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)(local_140->nodes).
                                            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start >> 4));
          }
          if (local_238.
              super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_238.
                            super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_238.
                                  super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_238.
                                  super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          if (local_208.m_data != (double *)0x0) {
            free((void *)local_208.m_data[-1]);
          }
          if (local_1e8.m_storage.m_data != (double *)0x0) {
            free((void *)local_1e8.m_storage.m_data[-1]);
          }
          if (local_218.m_storage.m_data != (double *)0x0) {
            free((void *)local_218.m_storage.m_data[-1]);
          }
          if (local_1d8.m_storage.m_data != (double *)0x0) {
            free((void *)local_1d8.m_storage.m_data[-1]);
          }
          return;
        }
        pcVar14 = 
        "Eigen::MapBase<Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, Level = 0]"
        ;
      }
      __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                    ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,pcVar14);
    }
  }
  pcVar14 = 
  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
  ;
LAB_00686085:
  __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,pcVar14);
}

Assistant:

void ChElementBeamTaperedTimoshenko::ComputeInternalForces(ChVectorDynamic<>& Fi) {
    assert(Fi.size() == 12);
    assert(tapered_section);

    // set up vector of nodal displacements and small rotations (in local element system)
    ChVectorDynamic<> displ(12);
    this->GetStateBlock(displ);

    // [local Internal Forces] = [Klocal] * displ + [Rlocal] * displ_dt
    ChVectorDynamic<> Fi_local = this->Km * displ;

    // set up vector of nodal velocities (in local element system)
    ChVectorDynamic<> displ_dt(12);
    this->GetField_dt(displ_dt);

    // ChMatrixDynamic<> FiR_local = this->tapered_section->GetBeamRaleyghDamping() * this->Km * displ_dt;
    ChMatrixDynamic<> FiR_local = this->Rm * displ_dt;

    Fi_local += FiR_local;
    Fi_local *= -1.0;

    //
    // Corotate local internal loads
    //

    // Fi = C * Fi_local  with C block-diagonal rotations A  , for nodal forces in abs. frame
    ChMatrix33<> Atoabs(this->q_element_abs_rot);
    ChMatrix33<> AtolocwelA(this->GetNodeA()->Frame().GetRot().GetConjugate() % this->q_element_abs_rot);
    ChMatrix33<> AtolocwelB(this->GetNodeB()->Frame().GetRot().GetConjugate() % this->q_element_abs_rot);
    std::vector<ChMatrix33<>*> R;
    R.push_back(&Atoabs);
    R.push_back(&AtolocwelA);
    R.push_back(&Atoabs);
    R.push_back(&AtolocwelB);
    ChMatrixCorotation::ComputeCK(Fi_local, R, 4, Fi);

    // Add also inertial quadratic terms: gyroscopic and centrifugal

    // CASE OF LUMPED MASS - fast
    double node_multiplier = 0.5 * length;
    ChVector<> mFcent_i;
    ChVector<> mTgyro_i;
    for (int i = 0; i < nodes.size(); ++i) {
        // int stride = i * 6;
        if (i == 0) {
            this->tapered_section->GetSectionA()->ComputeQuadraticTerms(mFcent_i, mTgyro_i, nodes[i]->GetWvel_loc());
        } else {  // i==1
            this->tapered_section->GetSectionB()->ComputeQuadraticTerms(mFcent_i, mTgyro_i, nodes[i]->GetWvel_loc());
        }
        ChQuaternion<> q_i(nodes[i]->GetRot());
        Fi.segment(i * 6, 3) -= node_multiplier * (nodes[i]->GetA() * mFcent_i).eigen();
        Fi.segment(3 + i * 6, 3) -= node_multiplier * mTgyro_i.eigen();
    }

#ifdef BEAM_VERBOSE
    GetLog() << "\nInternal forces (local): \n";
    for (int c = 0; c < 6; c++)
        GetLog() << FiK_local(c) << "  ";
    GetLog() << "\n";
    for (int c = 6; c < 12; c++)
        GetLog() << FiK_local(c) << "  ";
    GetLog() << "\n\nInternal forces (ABS) : \n";
    for (int c = 0; c < 6; c++)
        GetLog() << Fi(c) << "  ";
    GetLog() << "\n";
    for (int c = 6; c < 12; c++)
        GetLog() << Fi(c) << "  ";
    GetLog() << "\n";
#endif
}